

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O2

int writewbmp(Wbmp *wbmp,_func_void_int_void_ptr *putout,void *out)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  (*putout)(0,out);
  (*putout)(0,out);
  putmbi(wbmp->width,putout,out);
  putmbi(wbmp->height,putout,out);
  for (iVar3 = 0; iVar3 < wbmp->height; iVar3 = iVar3 + 1) {
    iVar4 = 0;
    iVar2 = 8;
    uVar1 = 0;
    while( true ) {
      if (wbmp->width <= iVar4) break;
      iVar2 = iVar2 + -1;
      uVar1 = (uint)(wbmp->bitmap[wbmp->width * iVar3 + iVar4] == 1) << ((byte)iVar2 & 0x1f) | uVar1
      ;
      if (iVar2 == 0) {
        (*putout)(uVar1,out);
        uVar1 = 0;
        iVar2 = 8;
      }
      iVar4 = iVar4 + 1;
    }
    if (iVar2 != 8) {
      (*putout)(uVar1,out);
    }
  }
  return 0;
}

Assistant:

int writewbmp(Wbmp *wbmp, void (*putout)(int c, void *out), void *out)
{
	int row, col;
	int bitpos, octet;

	/* Generate the header */
	putout(0, out); /* WBMP Type 0: B/W, Uncompressed bitmap */
	putout(0, out); /* FixHeaderField */

	/* Size of the image */
	putmbi(wbmp->width, putout, out);	/* width */
	putmbi(wbmp->height, putout, out);	/* height */


	/* Image data */
	for(row = 0; row < wbmp->height; row++) {
		bitpos = 8;
		octet = 0;

		for(col = 0; col < wbmp->width; col++) {
			octet |= ((wbmp->bitmap[row * wbmp->width + col] == 1) ? WBMP_WHITE : WBMP_BLACK) << --bitpos;
			if(bitpos == 0) {
				bitpos = 8;
				putout(octet, out);
				octet = 0;
			}
		}

		if(bitpos != 8) {
			putout(octet, out);
		}
	}

	return 0;
}